

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film_grain_table_test.cc
# Opt level: O0

void __thiscall
FilmGrainTableTest_SplitSingleSegment_Test::TestBody
          (FilmGrainTableTest_SplitSingleSegment_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  char *pcVar4;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  aom_film_grain_t grain;
  aom_film_grain_table_t table;
  int *in_stack_fffffffffffff988;
  aom_film_grain_table_entry_t *in_stack_fffffffffffff990;
  aom_film_grain_table_t *t;
  undefined7 in_stack_fffffffffffff998;
  undefined1 in_stack_fffffffffffff99f;
  char *in_stack_fffffffffffff9a0;
  char *in_stack_fffffffffffff9a8;
  int iVar5;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffff9b0;
  undefined1 in_stack_fffffffffffff9b7;
  aom_film_grain_t *in_stack_fffffffffffff9b8;
  Type type;
  AssertHelper *in_stack_fffffffffffff9c0;
  AssertionResult *pAVar6;
  undefined7 in_stack_fffffffffffff9c8;
  undefined1 in_stack_fffffffffffff9cf;
  int64_t in_stack_fffffffffffff9d0;
  aom_film_grain_table_t *in_stack_fffffffffffff9d8;
  char *in_stack_fffffffffffff9f0;
  undefined7 in_stack_fffffffffffff9f8;
  undefined1 in_stack_fffffffffffff9ff;
  char *in_stack_fffffffffffffa00;
  AssertionResult *in_stack_fffffffffffffa08;
  AssertionResult *this_01;
  undefined7 in_stack_fffffffffffffa10;
  undefined1 in_stack_fffffffffffffa17;
  aom_film_grain_table_t local_518 [2];
  undefined4 local_4f4;
  AssertionResult local_4f0 [2];
  AssertionResult local_4d0;
  uint local_4bc;
  undefined8 local_4a8;
  AssertionResult local_4a0 [2];
  undefined4 local_47c;
  AssertionResult local_478 [2];
  undefined4 local_454;
  AssertionResult local_450;
  string local_440 [52];
  int local_40c;
  AssertionResult local_408 [2];
  undefined4 local_3e4;
  AssertionResult local_3e0 [2];
  undefined4 local_3bc;
  AssertionResult local_3b8 [2];
  AssertionResult local_398;
  string local_388 [52];
  int local_354;
  AssertionResult local_350 [2];
  undefined4 local_32c;
  AssertionResult local_328 [2];
  AssertionResult local_308;
  string local_2f8 [68];
  int local_2b4;
  AssertionResult local_2b0 [41];
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_18 = 0;
  uStack_10 = 0;
  aom_film_grain_table_append
            ((aom_film_grain_table_t *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0)
             ,(int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0,
             (aom_film_grain_t *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998));
  local_2b4 = aom_film_grain_table_lookup
                        (in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
                         CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8),
                         (int)((ulong)in_stack_fffffffffffff9c0 >> 0x20),in_stack_fffffffffffff9b8);
  testing::AssertionResult::AssertionResult<int>
            ((AssertionResult *)in_stack_fffffffffffff990,in_stack_fffffffffffff988,(type *)0x55c3ca
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff9c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,
               (char *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
               in_stack_fffffffffffff9f0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff9c0,(Type)((ulong)in_stack_fffffffffffff9b8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20),in_stack_fffffffffffff9a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),
               (Message *)in_stack_fffffffffffffa08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff990);
    std::__cxx11::string::~string(local_2f8);
    testing::Message::~Message((Message *)0x55c4b4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x55c52c);
  testing::internal::EqHelper::Compare<aom_film_grain_table_entry_t>
            (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
             (nullptr_t)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
             in_stack_fffffffffffff990);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_308);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff9c0);
    testing::AssertionResult::failure_message((AssertionResult *)0x55c5d1);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff9c0,(Type)((ulong)in_stack_fffffffffffff9b8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20),in_stack_fffffffffffff9a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),
               (Message *)in_stack_fffffffffffffa08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff990);
    testing::Message::~Message((Message *)0x55c634);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x55c689);
  local_32c = 100;
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
             (int *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
             (long *)in_stack_fffffffffffff990);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_328);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff9c0);
    testing::AssertionResult::failure_message((AssertionResult *)0x55c73d);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff9c0,(Type)((ulong)in_stack_fffffffffffff9b8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20),in_stack_fffffffffffff9a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),
               (Message *)in_stack_fffffffffffffa08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff990);
    testing::Message::~Message((Message *)0x55c7a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x55c7f8);
  local_354 = aom_film_grain_table_lookup
                        (in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
                         CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8),
                         (int)((ulong)in_stack_fffffffffffff9c0 >> 0x20),in_stack_fffffffffffff9b8);
  testing::AssertionResult::AssertionResult<int>
            ((AssertionResult *)in_stack_fffffffffffff990,in_stack_fffffffffffff988,(type *)0x55c844
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_350);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff9c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,
               (char *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
               in_stack_fffffffffffff9f0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff9c0,(Type)((ulong)in_stack_fffffffffffff9b8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20),in_stack_fffffffffffff9a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),
               (Message *)in_stack_fffffffffffffa08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff990);
    std::__cxx11::string::~string(local_388);
    testing::Message::~Message((Message *)0x55c940);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x55c9b8);
  testing::internal::EqHelper::Compare<aom_film_grain_table_entry_t>
            (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
             (nullptr_t)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
             in_stack_fffffffffffff990);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_398);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff9c0);
    testing::AssertionResult::failure_message((AssertionResult *)0x55ca5d);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff9c0,(Type)((ulong)in_stack_fffffffffffff9b8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20),in_stack_fffffffffffff9a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),
               (Message *)in_stack_fffffffffffffa08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff990);
    testing::Message::~Message((Message *)0x55cac0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x55cb15);
  local_3bc = 100;
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
             (int *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
             (long *)in_stack_fffffffffffff990);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff9c0);
    testing::AssertionResult::failure_message((AssertionResult *)0x55cbc9);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff9c0,(Type)((ulong)in_stack_fffffffffffff9b8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20),in_stack_fffffffffffff9a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),
               (Message *)in_stack_fffffffffffffa08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff990);
    testing::Message::~Message((Message *)0x55cc2c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x55cc81);
  local_3e4 = 900;
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
             (int *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
             (long *)in_stack_fffffffffffff990);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3e0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff9c0);
    testing::AssertionResult::failure_message((AssertionResult *)0x55cd35);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff9c0,(Type)((ulong)in_stack_fffffffffffff9b8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20),in_stack_fffffffffffff9a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),
               (Message *)in_stack_fffffffffffffa08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff990);
    testing::Message::~Message((Message *)0x55cd98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x55cdf0);
  local_40c = aom_film_grain_table_lookup
                        (in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
                         CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8),
                         (int)((ulong)in_stack_fffffffffffff9c0 >> 0x20),in_stack_fffffffffffff9b8);
  type = (Type)((ulong)in_stack_fffffffffffff9b8 >> 0x20);
  testing::AssertionResult::AssertionResult<int>
            ((AssertionResult *)in_stack_fffffffffffff990,in_stack_fffffffffffff988,(type *)0x55ce3c
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_408);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff9c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,
               (char *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
               in_stack_fffffffffffff9f0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff9c0,type,
               (char *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20),in_stack_fffffffffffff9a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),
               (Message *)in_stack_fffffffffffffa08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff990);
    std::__cxx11::string::~string(local_440);
    testing::Message::~Message((Message *)0x55cf38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x55cfb0);
  local_454 = 100;
  this_01 = &local_450;
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
             (int *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
             (long *)in_stack_fffffffffffff990);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff9c0);
    testing::AssertionResult::failure_message((AssertionResult *)0x55d064);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff9c0,type,
               (char *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20),in_stack_fffffffffffff9a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffa10),(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff990);
    testing::Message::~Message((Message *)0x55d0c1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x55d116);
  local_47c = 400;
  pAVar6 = local_478;
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
             (int *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
             (long *)in_stack_fffffffffffff990);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar6);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff9c0);
    testing::AssertionResult::failure_message((AssertionResult *)0x55d1be);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff9c0,type,
               (char *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20),in_stack_fffffffffffff9a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffa10),(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff990);
    testing::Message::~Message((Message *)0x55d21b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x55d270);
  local_4a8 = 0;
  pAVar6 = local_4a0;
  testing::internal::CmpHelperNE<decltype(nullptr),aom_film_grain_table_entry_t*>
            (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
             (void **)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
             (aom_film_grain_table_entry_t **)in_stack_fffffffffffff990);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar6);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff9c0);
    testing::AssertionResult::failure_message((AssertionResult *)0x55d319);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff9c0,type,
               (char *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20),in_stack_fffffffffffff9a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffa10),(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff990);
    testing::Message::~Message((Message *)0x55d376);
  }
  local_4bc = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x55d3e4);
  if (local_4bc == 0) {
    pAVar6 = &local_4d0;
    testing::internal::EqHelper::
    Compare<aom_film_grain_table_entry_t_*,_aom_film_grain_table_entry_t_*,_nullptr>
              (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
               (aom_film_grain_table_entry_t **)
               CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
               (aom_film_grain_table_entry_t **)in_stack_fffffffffffff990);
    iVar5 = (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar6);
    if (!bVar1) {
      testing::Message::Message((Message *)pAVar6);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x55d493);
      type = (Type)((ulong)pcVar4 >> 0x20);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)pAVar6,type,
                 (char *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),iVar5,
                 in_stack_fffffffffffff9a0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffa10),(Message *)this_01);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff990);
      testing::Message::~Message((Message *)0x55d4f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x55d545);
    local_4f4 = 600;
    this_00 = local_4f0;
    testing::internal::EqHelper::Compare<int,_long,_nullptr>
              (&this_00->success_,in_stack_fffffffffffff9a0,
               (int *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
               (long *)in_stack_fffffffffffff990);
    uVar3 = testing::AssertionResult::operator_cast_to_bool(this_00);
    if (!(bool)uVar3) {
      testing::Message::Message((Message *)pAVar6);
      in_stack_fffffffffffff9a0 =
           testing::AssertionResult::failure_message((AssertionResult *)0x55d5f4);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)pAVar6,type,(char *)CONCAT17(uVar3,in_stack_fffffffffffff9b0),
                 (int)((ulong)this_00 >> 0x20),in_stack_fffffffffffff9a0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffa10),(Message *)this_01);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff990);
      testing::Message::~Message((Message *)0x55d651);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x55d6a6);
    t = local_518;
    testing::internal::EqHelper::Compare<int,_long,_nullptr>
              (&this_00->success_,in_stack_fffffffffffff9a0,
               (int *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),(long *)t);
    iVar5 = (int)((ulong)this_00 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)t);
    if (!bVar1) {
      testing::Message::Message((Message *)pAVar6);
      testing::AssertionResult::failure_message((AssertionResult *)0x55d755);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)pAVar6,type,(char *)CONCAT17(uVar3,in_stack_fffffffffffff9b0),iVar5
                 ,in_stack_fffffffffffff9a0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffa10),(Message *)this_01);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)t);
      testing::Message::~Message((Message *)0x55d7b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x55d805);
    aom_film_grain_table_free(t);
  }
  return;
}

Assistant:

TEST(FilmGrainTableTest, SplitSingleSegment) {
  aom_film_grain_table_t table;
  aom_film_grain_t grain;
  memset(&table, 0, sizeof(table));

  aom_film_grain_table_append(&table, 0, 1000, film_grain_test_vectors + 0);

  // Test lookup and remove that adjusts start time
  EXPECT_TRUE(aom_film_grain_table_lookup(&table, 0, 100, true, &grain));
  EXPECT_EQ(nullptr, table.head->next);
  EXPECT_EQ(100, table.head->start_time);

  // Test lookup and remove that adjusts end time
  EXPECT_TRUE(aom_film_grain_table_lookup(&table, 900, 1000, true, &grain));
  EXPECT_EQ(nullptr, table.head->next);
  EXPECT_EQ(100, table.head->start_time);
  EXPECT_EQ(900, table.head->end_time);

  // Test lookup and remove that splits the first entry
  EXPECT_TRUE(aom_film_grain_table_lookup(&table, 400, 600, true, &grain));
  EXPECT_EQ(100, table.head->start_time);
  EXPECT_EQ(400, table.head->end_time);

  ASSERT_NE(nullptr, table.head->next);
  EXPECT_EQ(table.tail, table.head->next);
  EXPECT_EQ(600, table.head->next->start_time);
  EXPECT_EQ(900, table.head->next->end_time);

  aom_film_grain_table_free(&table);
}